

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgUtils.cpp
# Opt level: O0

void rsg::computeUnifiedUniforms
               (Shader *vertexShader,Shader *fragmentShader,
               vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *uniforms
               )

{
  undefined1 local_50 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addedUniforms;
  vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *uniforms_local;
  Shader *fragmentShader_local;
  Shader *vertexShader_local;
  
  addedUniforms._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)uniforms;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_50);
  addNewUniforms((vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *)
                 addedUniforms._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,vertexShader);
  addNewUniforms((vector<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_> *)
                 addedUniforms._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50,fragmentShader);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_50);
  return;
}

Assistant:

void computeUnifiedUniforms (const Shader& vertexShader, const Shader& fragmentShader, std::vector<const ShaderInput*>& uniforms)
{
	set<string> addedUniforms;
	addNewUniforms(uniforms, addedUniforms, vertexShader);
	addNewUniforms(uniforms, addedUniforms, fragmentShader);
}